

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateShutdownCode
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  Descriptor *pDVar2;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  int i_1;
  long lVar3;
  int i;
  long lVar4;
  
  io::Printer::Print(printer,"delete $classname$::default_instance_;\n","classname",
                     &this->classname_);
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"delete $classname$_reflection_;\n","classname",&this->classname_);
  }
  lVar3 = 0;
  for (lVar4 = 0; pDVar2 = this->descriptor_, lVar4 < *(int *)(pDVar2 + 0x2c); lVar4 = lVar4 + 1) {
    pFVar1 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar3));
    (*pFVar1->_vptr_FieldGenerator[0xc])(pFVar1,printer);
    lVar3 = lVar3 + 0x78;
  }
  for (lVar3 = 0; lVar3 < *(int *)(pDVar2 + 0x38); lVar3 = lVar3 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,lVar3);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_00);
    GenerateShutdownCode(this_01,printer);
    pDVar2 = this->descriptor_;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateShutdownCode(io::Printer* printer) {
  printer->Print(
    "delete $classname$::default_instance_;\n",
    "classname", classname_);

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "delete $classname$_reflection_;\n",
      "classname", classname_);
  }

  // Handle default instances of fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateShutdownCode(printer);
  }

  // Handle nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateShutdownCode(printer);
  }
}